

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

int Abc_TtCountOnesInCofsSimple(word *pTruth,int nVars,int *pStore)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  Abc_TtCountOnesInCofs(pTruth,nVars,pStore);
  uVar1 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (nVars < 6) {
    uVar2 = 1 << ((byte)nVars & 0x1f);
    uVar5 = ~(-1L << ((byte)uVar2 & 0x3f)) & *pTruth;
    uVar4 = (ulong)uVar2;
    uVar6 = uVar5;
    if ((uint)nVars < 6) {
      do {
        uVar6 = uVar6 | uVar5 << ((byte)uVar4 & 0x3f);
        uVar4 = uVar4 + uVar2;
      } while (uVar4 < 0x40);
    }
    if (*pTruth != uVar6) {
      __assert_fail("*pTruth == nTruth",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
    }
  }
  if ((int)uVar1 < 1) {
    iVar3 = 0;
  }
  else {
    uVar4 = 0;
    iVar3 = 0;
    do {
      uVar6 = pTruth[uVar4];
      if (uVar6 != 0) {
        uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
        uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
        uVar6 = (uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f;
        uVar6 = (uVar6 >> 8) + uVar6;
        lVar7 = (uVar6 >> 0x10) + uVar6;
        iVar3 = iVar3 + ((int)((ulong)lVar7 >> 0x20) + (int)lVar7 & 0xffU);
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return iVar3;
}

Assistant:

int Abc_TtCountOnesInCofsSimple( word * pTruth, int nVars, int * pStore )
{
    Abc_TtCountOnesInCofs( pTruth, nVars, pStore );
    return Abc_TtCountOnesInTruth( pTruth, nVars );
}